

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClauseVec.c
# Opt level: O0

Msat_ClauseVec_t * Msat_ClauseVecAlloc(int nCap)

{
  Msat_ClauseVec_t *pMVar1;
  Msat_Clause_t **local_20;
  Msat_ClauseVec_t *p;
  int nCap_local;
  
  pMVar1 = (Msat_ClauseVec_t *)malloc(0x10);
  p._4_4_ = nCap;
  if ((0 < nCap) && (nCap < 0x10)) {
    p._4_4_ = 0x10;
  }
  pMVar1->nSize = 0;
  pMVar1->nCap = p._4_4_;
  if (pMVar1->nCap == 0) {
    local_20 = (Msat_Clause_t **)0x0;
  }
  else {
    local_20 = (Msat_Clause_t **)malloc((long)pMVar1->nCap << 3);
  }
  pMVar1->pArray = local_20;
  return pMVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates a vector with the given capacity.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Msat_ClauseVec_t * Msat_ClauseVecAlloc( int nCap )
{
    Msat_ClauseVec_t * p;
    p = ABC_ALLOC( Msat_ClauseVec_t, 1 );
    if ( nCap > 0 && nCap < 16 )
        nCap = 16;
    p->nSize  = 0;
    p->nCap   = nCap;
    p->pArray = p->nCap? ABC_ALLOC( Msat_Clause_t *, p->nCap ) : NULL;
    return p;
}